

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O3

int __thiscall ncnn::Scale::load_model(Scale *this,ModelBin *mb)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  void *local_58;
  int *local_50;
  size_t local_48;
  Allocator *local_40;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  size_t local_28;
  
  if (this->scale_data_size != 0xffffff17) {
    (**mb->_vptr_ModelBin)(&local_58,mb,(ulong)(uint)this->scale_data_size,1);
    if (&this->scale_data != (Mat *)&local_58) {
      if (local_50 != (int *)0x0) {
        LOCK();
        *local_50 = *local_50 + 1;
        UNLOCK();
      }
      piVar1 = (this->scale_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = (this->scale_data).data;
          pAVar3 = (this->scale_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(*(void **)((long)pvVar2 + -8));
            }
          }
          else {
            (**(code **)(*(long *)pAVar3 + 8))();
          }
        }
      }
      (this->scale_data).data = local_58;
      (this->scale_data).refcount = local_50;
      (this->scale_data).elemsize = local_48;
      (this->scale_data).allocator = local_40;
      (this->scale_data).dims = local_38;
      (this->scale_data).w = iStack_34;
      (this->scale_data).h = iStack_30;
      (this->scale_data).c = iStack_2c;
      (this->scale_data).cstep = local_28;
    }
    if (local_50 != (int *)0x0) {
      LOCK();
      *local_50 = *local_50 + -1;
      UNLOCK();
      if (*local_50 == 0) {
        if (local_40 == (Allocator *)0x0) {
          if (local_58 != (void *)0x0) {
            free(*(void **)((long)local_58 + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_40 + 8))();
        }
      }
    }
    if ((this->scale_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->scale_data).c * (this->scale_data).cstep == 0) {
      return -100;
    }
  }
  if (this->bias_term != 0) {
    (**mb->_vptr_ModelBin)(&local_58,mb,(ulong)(uint)this->scale_data_size,1);
    if (&this->bias_data != (Mat *)&local_58) {
      if (local_50 != (int *)0x0) {
        LOCK();
        *local_50 = *local_50 + 1;
        UNLOCK();
      }
      piVar1 = (this->bias_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = (this->bias_data).data;
          pAVar3 = (this->bias_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(*(void **)((long)pvVar2 + -8));
            }
          }
          else {
            (**(code **)(*(long *)pAVar3 + 8))();
          }
        }
      }
      (this->bias_data).data = local_58;
      (this->bias_data).refcount = local_50;
      (this->bias_data).elemsize = local_48;
      (this->bias_data).allocator = local_40;
      (this->bias_data).dims = local_38;
      (this->bias_data).w = iStack_34;
      (this->bias_data).h = iStack_30;
      (this->bias_data).c = iStack_2c;
      (this->bias_data).cstep = local_28;
    }
    if (local_50 != (int *)0x0) {
      LOCK();
      *local_50 = *local_50 + -1;
      UNLOCK();
      if (*local_50 == 0) {
        if (local_40 == (Allocator *)0x0) {
          if (local_58 != (void *)0x0) {
            free(*(void **)((long)local_58 + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_40 + 8))();
        }
      }
    }
    if ((this->bias_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Scale::load_model(const ModelBin& mb)
{
    if (scale_data_size != -233)
    {
        scale_data = mb.load(scale_data_size, 1);
        if (scale_data.empty())
            return -100;
    }

    if (bias_term)
    {
        bias_data = mb.load(scale_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}